

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

OPJ_BOOL opj_bio_byteout(opj_bio_t *bio)

{
  uint uVar1;
  OPJ_BYTE *pOVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = bio->buf;
  uVar3 = uVar1 & 0xff;
  bio->buf = uVar3 << 8;
  bio->ct = (uVar3 != 0xff) + 7;
  pOVar2 = bio->bp;
  bVar4 = pOVar2 < bio->end;
  if (bVar4) {
    bio->bp = pOVar2 + 1;
    *pOVar2 = (OPJ_BYTE)uVar1;
  }
  return (uint)bVar4;
}

Assistant:

static OPJ_BOOL opj_bio_byteout(opj_bio_t *bio)
{
    bio->buf = (bio->buf << 8) & 0xffff;
    bio->ct = bio->buf == 0xff00 ? 7 : 8;
    if ((OPJ_SIZE_T)bio->bp >= (OPJ_SIZE_T)bio->end) {
        return OPJ_FALSE;
    }
    *bio->bp++ = (OPJ_BYTE)(bio->buf >> 8);
    return OPJ_TRUE;
}